

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       set_caster<std::unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>,kratos::Var*>
       ::
       cast<std::unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>>
                 (unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                  *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  handle hVar2;
  __node_base *p_Var3;
  handle local_40;
  object value_;
  set s;
  
  set::set((set *)&value_);
  p_Var3 = &(src->_M_h)._M_before_begin;
  do {
    hVar2 = value_.super_handle.m_ptr;
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) {
      value_.super_handle.m_ptr = (handle)(PyObject *)0x0;
LAB_00326ddd:
      object::~object(&value_);
      return (handle)hVar2.m_ptr;
    }
    local_40 = type_caster_base<kratos::Var>::cast((itype *)p_Var3[1]._M_nxt,policy,parent);
    if (local_40.m_ptr == (PyObject *)0x0) {
LAB_00326dc7:
      object::~object((object *)&local_40);
      hVar2.m_ptr = (PyObject *)0x0;
      goto LAB_00326ddd;
    }
    bVar1 = set::add<pybind11::object&>((set *)&value_,(object *)&local_40);
    if (!bVar1) goto LAB_00326dc7;
    object::~object((object *)&local_40);
  } while( true );
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Key>::policy(policy);
        pybind11::set s;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(key_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_ || !s.add(value_))
                return handle();
        }
        return s.release();
    }